

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log-demo.cpp
# Opt level: O2

int main(void)

{
  duration_t this;
  __shared_ptr<tlog::ConsoleOutput,_(__gnu_cxx::_Lock_policy)2> *__r;
  duration<long,_std::ratio<1L,_1000000L>_> dur;
  int i_1;
  int i;
  uint64_t uVar1;
  initializer_list<std::shared_ptr<tlog::IOutput>_> __l;
  allocator local_12b;
  allocator_type local_12a;
  less<std::shared_ptr<tlog::IOutput>_> local_129;
  undefined1 local_128 [32];
  Logger scopedLogger;
  string local_88;
  Progress progress;
  _Rb_tree<std::shared_ptr<tlog::IOutput>,_std::shared_ptr<tlog::IOutput>,_std::_Identity<std::shared_ptr<tlog::IOutput>_>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  local_48;
  
  tlog::none();
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"===========================================\n");
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"===== tinylogger demo =====================\n");
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"===========================================");
  tlog::Stream::~Stream((Stream *)&scopedLogger);
  tlog::info();
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"This is an info message meant to let you know ");
  std::ostream::operator<<
            ((ostream *)
             scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             0x2a);
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,
                  " is the Answer to the Ultimate Question of Life, the Universe, and Everything");
  tlog::Stream::~Stream((Stream *)&scopedLogger);
  tlog::debug();
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,
                  "You can only see this message if this demo has been compiled in debug mode.");
  tlog::Stream::~Stream((Stream *)&scopedLogger);
  tlog::warning();
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"This ");
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"is ");
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"a ");
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"warning!");
  tlog::Stream::~Stream((Stream *)&scopedLogger);
  tlog::error();
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,
                  "This is an error message that is so long, it likely does not fit within a single line. "
                 );
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,
                  "The purpose of this message is to make sure line breaks do not break anything (get it?). "
                 );
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"This sentence only exists to make this message even longer.");
  tlog::Stream::~Stream((Stream *)&scopedLogger);
  tlog::info();
  std::operator<<((ostream *)
                  scopedLogger.mHiddenSeverities._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,"Demonstrating a progress bar...");
  tlog::Stream::~Stream((Stream *)&scopedLogger);
  tlog::progress(&progress,100);
  for (uVar1 = 1; uVar1 != 0x65; uVar1 = uVar1 + 1) {
    scopedLogger.mHiddenSeverities._M_t._M_impl._0_8_ = 10;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&scopedLogger);
    tlog::Progress::update(&progress,uVar1);
  }
  tlog::success();
  std::operator<<((ostream *)local_128._16_8_,"Progress finished after ");
  this = tlog::Progress::duration(&progress);
  tlog::durationToString<std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((string *)&scopedLogger,(tlog *)this.__r,dur);
  std::operator<<((ostream *)local_128._16_8_,(string *)&scopedLogger);
  std::__cxx11::string::~string((string *)&scopedLogger);
  tlog::Stream::~Stream((Stream *)local_128);
  std::__cxx11::string::string((string *)&local_88,"inner scope",&local_12b);
  __r = &tlog::ConsoleOutput::global()->
         super___shared_ptr<tlog::ConsoleOutput,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<tlog::IOutput,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tlog::ConsoleOutput,void>
            ((__shared_ptr<tlog::IOutput,(__gnu_cxx::_Lock_policy)2> *)local_128,__r);
  __l._M_len = 1;
  __l._M_array = (iterator)local_128;
  std::
  set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  ::set((set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
         *)&local_48,__l,&local_129,&local_12a);
  tlog::Logger::Logger
            (&scopedLogger,&local_88,
             (set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
              *)&local_48);
  std::
  _Rb_tree<std::shared_ptr<tlog::IOutput>,_std::shared_ptr<tlog::IOutput>,_std::_Identity<std::shared_ptr<tlog::IOutput>_>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  ::~_Rb_tree(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)local_128,"This info message is written by a scoped logger.",&local_12b);
  tlog::Logger::info(&scopedLogger,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  tlog::Progress::Progress((Progress *)local_128,&scopedLogger,100);
  progress.mTotal = local_128._16_8_;
  progress.mCurrent = local_128._24_8_;
  progress.mLogger = (Logger *)local_128._0_8_;
  progress.mStartTime.__d.__r = (duration)(duration)local_128._8_8_;
  for (uVar1 = 1; uVar1 != 0x65; uVar1 = uVar1 + 1) {
    local_128._0_8_ = (Logger *)0xa;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)local_128);
    tlog::Progress::update(&progress,uVar1);
  }
  std::__cxx11::string::string
            ((string *)local_128,"Now you know how to use scoped loggers!",&local_12b);
  tlog::Logger::success(&scopedLogger,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  tlog::success();
  std::operator<<((ostream *)local_128._16_8_,
                  "The demo application terminated successfully. Hooray!");
  tlog::Stream::~Stream((Stream *)local_128);
  tlog::Logger::~Logger(&scopedLogger);
  return 0;
}

Assistant:

int main() {
    tlog::none()
        << "===========================================\n"
        << "===== tinylogger demo =====================\n"
        << "===========================================";

    tlog::info()
        << "This is an info message meant to let you know "
        << 42 <<
        " is the Answer to the Ultimate Question of Life, the Universe, and Everything";

    tlog::debug() << "You can only see this message if this demo has been compiled in debug mode.";

    tlog::warning() << "This " << "is " << "a " << "warning!";

    tlog::error()
        << "This is an error message that is so long, it likely does not fit within a single line. "
        << "The purpose of this message is to make sure line breaks do not break anything (get it?). "
        << "This sentence only exists to make this message even longer.";

    tlog::info() << "Demonstrating a progress bar...";

    static const int N = 100;

    auto progress = tlog::progress(N);
    for (int i = 1; i <= N; ++i) {
        std::this_thread::sleep_for(std::chrono::milliseconds{10});
        progress.update(i);
    }

    tlog::success() << "Progress finished after " << tlog::durationToString(progress.duration());

    auto scopedLogger = tlog::Logger("inner scope");
    scopedLogger.info("This info message is written by a scoped logger.");
    progress = scopedLogger.progress(N);
    for (int i = 1; i <= N; ++i) {
        std::this_thread::sleep_for(std::chrono::milliseconds{10});
        progress.update(i);
    }
    scopedLogger.success("Now you know how to use scoped loggers!");

    tlog::success() << "The demo application terminated successfully. Hooray!";
}